

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ringbuffer.cpp
# Opt level: O1

size_t __thiscall RingbufferBase::fullRead(RingbufferBase *this,void *buf,size_t sizeInBytes)

{
  ma_uint32 mVar1;
  size_t sVar2;
  ssize_t sVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *__buf;
  
  mVar1 = ma_rb_available_read(&this->mRingbuffer);
  if (mVar1 == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = read(this,(int)buf,(void *)sizeInBytes,CONCAT71(in_register_00000009,in_CL));
    __buf = (void *)(sizeInBytes - sVar2);
    if (sVar2 != mVar1 && __buf != (void *)0x0) {
      sVar3 = read(this,(int)buf + (int)sVar2,__buf,
                   CONCAT71(in_register_00000009,sVar2 == mVar1 || __buf == (void *)0x0));
      sVar2 = sVar2 + sVar3;
    }
  }
  return sVar2;
}

Assistant:

size_t RingbufferBase::fullRead(void *buf, size_t sizeInBytes) {
    size_t readAvail = ma_rb_available_read(&mRingbuffer);

    if (readAvail == 0) {
        return 0;
    }

    // do the first read
    size_t bytesRead = read(buf, sizeInBytes);

    sizeInBytes -= bytesRead;
    readAvail -= bytesRead;

    if (sizeInBytes != 0 && readAvail) {
        // do the second read (the read pointer starts at the beginning)
        bytesRead += read(reinterpret_cast<uint8_t*>(buf) + bytesRead, sizeInBytes);

    }

    return bytesRead;
}